

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileValue
          (NodeTranslator *this,Reader source,Reader type,Schema typeScope,Builder target,
          bool isBootstrap)

{
  CapTableBuilder **resolver;
  StringPtr name;
  Reader src;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  Which WVar4;
  uint16_t value_00;
  NullableValue<capnp::Type> *other;
  Type *pTVar5;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> *other_00;
  Orphan<capnp::DynamicValue> *pOVar6;
  Builder *value_01;
  ReaderFor<capnp::DynamicEnum> RVar7;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_> local_328;
  Schema local_2f8;
  uint16_t local_2f0;
  Reader local_2e8;
  DynamicEnum local_2a0;
  Orphan<capnp::DynamicValue> *local_290;
  Orphan<capnp::DynamicValue> *value;
  undefined8 uStack_280;
  SegmentReader *local_278;
  CapTableReader *pCStack_270;
  void *local_268;
  WirePointer *pWStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  Maybe<capnp::Orphan<capnp::DynamicValue>_> local_248;
  undefined1 local_208 [8];
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> _value1851;
  FieldSubset local_1c0;
  Field local_178;
  Reader local_138;
  ArrayPtr<const_char> local_108;
  char *pcStack_f8;
  StringPtr fieldName;
  Type *typeSchema;
  Maybe<capnp::Type> local_98;
  undefined1 local_80 [8];
  NullableValue<capnp::Type> _typeSchema1847;
  undefined1 local_58 [8];
  ValueTranslator valueTranslator;
  ResolverGlue glue;
  bool isBootstrap_local;
  NodeTranslator *this_local;
  Schema typeScope_local;
  
  src._reader = source._reader;
  resolver = &valueTranslator.orphanage.capTable;
  compileValue(capnp::compiler::Expression::Reader,capnp::schema::Type::Reader,capnp::Schema,capnp::
  schema::Value::Builder,bool)::ResolverGlue::ResolverGlue(capnp::compiler::NodeTranslator__bool_
            (resolver,this,isBootstrap);
  _typeSchema1847.field_1.value.field_4 =
       (anon_union_8_2_eba6ea51_for_Type_5)(this->orphanage).arena;
  ValueTranslator::ValueTranslator
            ((ValueTranslator *)local_58,(Resolver *)resolver,this->errorReporter,this->orphanage);
  (*this->resolver->_vptr_Resolver[10])(&local_98,this->resolver,typeScope.raw);
  other = kj::_::readMaybe<capnp::Type>(&local_98);
  kj::_::NullableValue<capnp::Type>::NullableValue((NullableValue<capnp::Type> *)local_80,other);
  kj::Maybe<capnp::Type>::~Maybe(&local_98);
  pTVar5 = kj::_::NullableValue::operator_cast_to_Type_((NullableValue *)local_80);
  if (pTVar5 != (Type *)0x0) {
    fieldName.content.size_ =
         (size_t)kj::_::NullableValue<capnp::Type>::operator*
                           ((NullableValue<capnp::Type> *)local_80);
    _value1851.field_1.value.builder.location = (word *)Schema::from<capnp::schema::Type>();
    StructSchema::getUnionFields
              (&local_1c0,(StructSchema *)&_value1851.field_1.value.builder.location);
    WVar4 = capnp::Type::which((Type *)fieldName.content.size_);
    StructSchema::FieldSubset::operator[](&local_178,&local_1c0,(uint)WVar4);
    StructSchema::Field::getProto(&local_138,&local_178);
    local_108 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_138);
    fieldName.content.ptr = (char *)local_108.size_;
    pcStack_f8 = local_108.ptr;
    local_278 = source._reader.segment;
    pCStack_270 = source._reader.capTable;
    local_268 = source._reader.data;
    pWStack_260 = source._reader.pointers;
    local_258._0_4_ = source._reader.dataSize;
    local_258._4_2_ = source._reader.pointerCount;
    local_258._6_2_ = source._reader._38_2_;
    source._reader._40_8_ = src._reader._40_8_;
    uStack_250._0_4_ = source._reader.nestingLimit;
    uStack_250._4_4_ = source._reader._44_4_;
    value = *(Orphan<capnp::DynamicValue> **)fieldName.content.size_;
    uStack_280 = *(undefined8 *)(fieldName.content.size_ + 8);
    ValueTranslator::compileValue
              (&local_248,(ValueTranslator *)local_58,src,*(Type *)fieldName.content.size_);
    other_00 = kj::_::readMaybe<capnp::Orphan<capnp::DynamicValue>>(&local_248);
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208,other_00);
    kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::~Maybe(&local_248);
    pOVar6 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_208);
    if (pOVar6 != (Orphan<capnp::DynamicValue> *)0x0) {
      local_290 = kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::operator*
                            ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208);
      bVar3 = capnp::Type::isEnum((Type *)fieldName.content.size_);
      if (bVar3) {
        Orphan<capnp::DynamicValue>::getReader(&local_2e8,local_290);
        RVar7 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_2e8);
        local_2f8.raw = (RawBrandedSchema *)RVar7.schema.super_Schema.raw;
        local_2f0 = RVar7.value;
        local_2a0.schema.super_Schema.raw = (Schema)(Schema)local_2f8.raw;
        local_2a0.value = local_2f0;
        value_00 = DynamicEnum::getRaw(&local_2a0);
        capnp::schema::Value::Builder::setEnum(&target,value_00);
        DynamicValue::Reader::~Reader(&local_2e8);
      }
      else {
        toDynamic<capnp::schema::Value::Builder&>(&local_328,(capnp *)&target,value_01);
        pcVar2 = fieldName.content.ptr;
        pcVar1 = pcStack_f8;
        pOVar6 = kj::mv<capnp::Orphan<capnp::DynamicValue>>(local_290);
        name.content.size_ = (size_t)pcVar2;
        name.content.ptr = pcVar1;
        DynamicStruct::Builder::adopt(&local_328,name,pOVar6);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_208);
  }
  kj::_::NullableValue<capnp::Type>::~NullableValue((NullableValue<capnp::Type> *)local_80);
  return;
}

Assistant:

void NodeTranslator::compileValue(Expression::Reader source, schema::Type::Reader type,
                                  Schema typeScope, schema::Value::Builder target,
                                  bool isBootstrap) {
  class ResolverGlue: public ValueTranslator::Resolver {
  public:
    inline ResolverGlue(NodeTranslator& translator, bool isBootstrap)
        : translator(translator), isBootstrap(isBootstrap) {}

    kj::Maybe<DynamicValue::Reader> resolveConstant(Expression::Reader name) override {
      return translator.readConstant(name, isBootstrap);
    }

    kj::Maybe<kj::Array<const byte>> readEmbed(LocatedText::Reader filename) override {
      return translator.readEmbed(filename);
    }

  private:
    NodeTranslator& translator;
    bool isBootstrap;
  };

  ResolverGlue glue(*this, isBootstrap);
  ValueTranslator valueTranslator(glue, errorReporter, orphanage);

  KJ_IF_SOME(typeSchema, resolver.resolveBootstrapType(type, typeScope)) {
    kj::StringPtr fieldName = Schema::from<schema::Type>()
        .getUnionFields()[static_cast<uint>(typeSchema.which())].getProto().getName();

    KJ_IF_SOME(value, valueTranslator.compileValue(source, typeSchema)) {
      if (typeSchema.isEnum()) {
        target.setEnum(value.getReader().as<DynamicEnum>().getRaw());
      } else {
        toDynamic(target).adopt(fieldName, kj::mv(value));
      }
    }
  }
}